

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cpp
# Opt level: O1

string * __thiscall
loader::to_string_abi_cxx11_(string *__return_storage_ptr__,loader *this,ze_result_t result)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  ulong uVar4;
  uint __val;
  uint uVar5;
  char *pcVar6;
  uint __len;
  
  uVar5 = (uint)this;
  if ((int)uVar5 < 0x70020001) {
    if ((int)uVar5 < 0x70010000) {
      switch(uVar5) {
      case 0x70000001:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar6 = "ZE_RESULT_ERROR_DEVICE_LOST";
        pcVar3 = "";
        break;
      case 0x70000002:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar6 = "ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY";
        pcVar3 = "";
        break;
      case 0x70000003:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar6 = "ZE_RESULT_ERROR_OUT_OF_DEVICE_MEMORY";
        pcVar3 = "";
        break;
      case 0x70000004:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar6 = "ZE_RESULT_ERROR_MODULE_BUILD_FAILURE";
        pcVar3 = "";
        break;
      case 0x70000005:
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar6 = "ZE_RESULT_ERROR_MODULE_LINK_FAILURE";
        pcVar3 = "";
        break;
      default:
        if (uVar5 == 0) {
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar6 = "ZE_RESULT_SUCCESS";
          pcVar3 = "";
        }
        else {
          if (uVar5 != 1) {
LAB_001b7e3e:
            __val = -uVar5;
            if (0 < (int)uVar5) {
              __val = uVar5;
            }
            __len = 1;
            if (9 < __val) {
              uVar4 = (ulong)__val;
              uVar1 = 4;
              do {
                __len = uVar1;
                uVar2 = (uint)uVar4;
                if (uVar2 < 100) {
                  __len = __len - 2;
                  goto LAB_001b8154;
                }
                if (uVar2 < 1000) {
                  __len = __len - 1;
                  goto LAB_001b8154;
                }
                if (uVar2 < 10000) goto LAB_001b8154;
                uVar4 = uVar4 / 10000;
                uVar1 = __len + 4;
              } while (99999 < uVar2);
              __len = __len + 1;
            }
LAB_001b8154:
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            std::__cxx11::string::_M_construct
                      ((ulong)__return_storage_ptr__,
                       (char)__len - ((char)((ulong)this >> 0x18) >> 7));
            std::__detail::__to_chars_10_impl<unsigned_int>
                      ((__return_storage_ptr__->_M_dataplus)._M_p + (uVar5 >> 0x1f),__len,__val);
            return __return_storage_ptr__;
          }
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
          pcVar6 = "ZE_RESULT_NOT_READY";
          pcVar3 = "";
        }
      }
    }
    else if (uVar5 == 0x70010000) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "ZE_RESULT_ERROR_INSUFFICIENT_PERMISSIONS";
      pcVar3 = "";
    }
    else if (uVar5 == 0x70010001) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "ZE_RESULT_ERROR_NOT_AVAILABLE";
      pcVar3 = "";
    }
    else {
      if (uVar5 != 0x70020000) goto LAB_001b7e3e;
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "ZE_RESULT_ERROR_DEPENDENCY_UNAVAILABLE";
      pcVar3 = "";
    }
  }
  else {
    switch(uVar5) {
    case 0x78000001:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "ZE_RESULT_ERROR_UNINITIALIZED";
      pcVar3 = "";
      break;
    case 0x78000002:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "ZE_RESULT_ERROR_UNSUPPORTED_VERSION";
      pcVar3 = "";
      break;
    case 0x78000003:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "ZE_RESULT_ERROR_UNSUPPORTED_FEATURE";
      pcVar3 = "";
      break;
    case 0x78000004:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "ZE_RESULT_ERROR_INVALID_ARGUMENT";
      pcVar3 = "";
      break;
    case 0x78000005:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "ZE_RESULT_ERROR_INVALID_NULL_HANDLE";
      pcVar3 = "";
      break;
    case 0x78000006:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE";
      pcVar3 = "";
      break;
    case 0x78000007:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "ZE_RESULT_ERROR_INVALID_NULL_POINTER";
      pcVar3 = "";
      break;
    case 0x78000008:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "ZE_RESULT_ERROR_INVALID_SIZE";
      pcVar3 = "";
      break;
    case 0x78000009:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "ZE_RESULT_ERROR_UNSUPPORTED_SIZE";
      pcVar3 = "";
      break;
    case 0x7800000a:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "ZE_RESULT_ERROR_UNSUPPORTED_ALIGNMENT";
      pcVar3 = "";
      break;
    case 0x7800000b:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "ZE_RESULT_ERROR_INVALID_SYNCHRONIZATION_OBJECT";
      pcVar3 = "";
      break;
    case 0x7800000c:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "ZE_RESULT_ERROR_INVALID_ENUMERATION";
      pcVar3 = "";
      break;
    case 0x7800000d:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "ZE_RESULT_ERROR_UNSUPPORTED_ENUMERATION";
      pcVar3 = "";
      break;
    case 0x7800000e:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "ZE_RESULT_ERROR_UNSUPPORTED_IMAGE_FORMAT";
      pcVar3 = "";
      break;
    case 0x7800000f:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "ZE_RESULT_ERROR_INVALID_NATIVE_BINARY";
      pcVar3 = "";
      break;
    case 0x78000010:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "ZE_RESULT_ERROR_INVALID_GLOBAL_NAME";
      pcVar3 = "";
      break;
    case 0x78000011:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "ZE_RESULT_ERROR_INVALID_KERNEL_NAME";
      pcVar3 = "";
      break;
    case 0x78000012:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "ZE_RESULT_ERROR_INVALID_FUNCTION_NAME";
      pcVar3 = "";
      break;
    case 0x78000013:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "ZE_RESULT_ERROR_INVALID_GROUP_SIZE_DIMENSION";
      pcVar3 = "";
      break;
    case 0x78000014:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "ZE_RESULT_ERROR_INVALID_GLOBAL_WIDTH_DIMENSION";
      pcVar3 = "";
      break;
    case 0x78000015:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "ZE_RESULT_ERROR_INVALID_KERNEL_ARGUMENT_INDEX";
      pcVar3 = "";
      break;
    case 0x78000016:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "ZE_RESULT_ERROR_INVALID_KERNEL_ARGUMENT_SIZE";
      pcVar3 = "";
      break;
    case 0x78000017:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "ZE_RESULT_ERROR_INVALID_KERNEL_ATTRIBUTE_VALUE";
      pcVar3 = "";
      break;
    case 0x78000018:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "ZE_RESULT_ERROR_INVALID_MODULE_UNLINKED";
      pcVar3 = "";
      break;
    case 0x78000019:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "ZE_RESULT_ERROR_INVALID_COMMAND_LIST_TYPE";
      pcVar3 = "";
      break;
    case 0x7800001a:
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar6 = "ZE_RESULT_ERROR_OVERLAPPING_REGIONS";
      pcVar3 = "";
      break;
    default:
      if (uVar5 == 0x70020001) {
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar6 = "ZE_RESULT_WARNING_DROPPED_DATA";
        pcVar3 = "";
      }
      else {
        if (uVar5 != 0x7ffffffe) goto LAB_001b7e3e;
        (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
        pcVar6 = "ZE_RESULT_ERROR_UNKNOWN";
        pcVar3 = "";
      }
    }
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar6,pcVar3);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const ze_result_t result) {
    if (result == ZE_RESULT_SUCCESS) {
        return "ZE_RESULT_SUCCESS";
    } else if (result == ZE_RESULT_NOT_READY) {
        return "ZE_RESULT_NOT_READY";
    } else if (result == ZE_RESULT_ERROR_UNINITIALIZED) {
        return "ZE_RESULT_ERROR_UNINITIALIZED";
    } else if (result == ZE_RESULT_ERROR_DEVICE_LOST) {
        return "ZE_RESULT_ERROR_DEVICE_LOST";
    } else if (result == ZE_RESULT_ERROR_INVALID_ARGUMENT) {
        return "ZE_RESULT_ERROR_INVALID_ARGUMENT";
    } else if (result == ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY) {
        return "ZE_RESULT_ERROR_OUT_OF_HOST_MEMORY";
    } else if (result == ZE_RESULT_ERROR_OUT_OF_DEVICE_MEMORY) {
        return "ZE_RESULT_ERROR_OUT_OF_DEVICE_MEMORY";
    } else if (result == ZE_RESULT_ERROR_MODULE_BUILD_FAILURE) {
        return "ZE_RESULT_ERROR_MODULE_BUILD_FAILURE";
    } else if (result == ZE_RESULT_ERROR_MODULE_LINK_FAILURE) {
        return "ZE_RESULT_ERROR_MODULE_LINK_FAILURE";
    } else if (result == ZE_RESULT_ERROR_INSUFFICIENT_PERMISSIONS) {
        return "ZE_RESULT_ERROR_INSUFFICIENT_PERMISSIONS";
    } else if (result == ZE_RESULT_ERROR_NOT_AVAILABLE) {
        return "ZE_RESULT_ERROR_NOT_AVAILABLE";
    } else if (result == ZE_RESULT_ERROR_DEPENDENCY_UNAVAILABLE) {
        return "ZE_RESULT_ERROR_DEPENDENCY_UNAVAILABLE";
    } else if (result == ZE_RESULT_WARNING_DROPPED_DATA) {
        return "ZE_RESULT_WARNING_DROPPED_DATA";
    } else if (result == ZE_RESULT_ERROR_UNSUPPORTED_VERSION) {
        return "ZE_RESULT_ERROR_UNSUPPORTED_VERSION";
    } else if (result == ZE_RESULT_ERROR_UNSUPPORTED_FEATURE) {
        return "ZE_RESULT_ERROR_UNSUPPORTED_FEATURE";
    } else if (result == ZE_RESULT_ERROR_INVALID_NULL_HANDLE) {
        return "ZE_RESULT_ERROR_INVALID_NULL_HANDLE";
    } else if (result == ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE) {
        return "ZE_RESULT_ERROR_HANDLE_OBJECT_IN_USE";
    } else if (result == ZE_RESULT_ERROR_INVALID_NULL_POINTER) {
        return "ZE_RESULT_ERROR_INVALID_NULL_POINTER";
    } else if (result == ZE_RESULT_ERROR_INVALID_SIZE) {
        return "ZE_RESULT_ERROR_INVALID_SIZE";
    } else if (result == ZE_RESULT_ERROR_UNSUPPORTED_SIZE) {
        return "ZE_RESULT_ERROR_UNSUPPORTED_SIZE";
    } else if (result == ZE_RESULT_ERROR_UNSUPPORTED_ALIGNMENT) {
        return "ZE_RESULT_ERROR_UNSUPPORTED_ALIGNMENT";
    } else if (result == ZE_RESULT_ERROR_INVALID_SYNCHRONIZATION_OBJECT) {
        return "ZE_RESULT_ERROR_INVALID_SYNCHRONIZATION_OBJECT";
    } else if (result == ZE_RESULT_ERROR_INVALID_ENUMERATION) {
        return "ZE_RESULT_ERROR_INVALID_ENUMERATION";
    } else if (result == ZE_RESULT_ERROR_UNSUPPORTED_ENUMERATION) {
        return "ZE_RESULT_ERROR_UNSUPPORTED_ENUMERATION";
    } else if (result == ZE_RESULT_ERROR_UNSUPPORTED_IMAGE_FORMAT) {
        return "ZE_RESULT_ERROR_UNSUPPORTED_IMAGE_FORMAT";
    } else if (result == ZE_RESULT_ERROR_INVALID_NATIVE_BINARY) {
        return "ZE_RESULT_ERROR_INVALID_NATIVE_BINARY";
    } else if (result == ZE_RESULT_ERROR_INVALID_GLOBAL_NAME) {
        return "ZE_RESULT_ERROR_INVALID_GLOBAL_NAME";
    } else if (result == ZE_RESULT_ERROR_INVALID_KERNEL_NAME) {
        return "ZE_RESULT_ERROR_INVALID_KERNEL_NAME";
    } else if (result == ZE_RESULT_ERROR_INVALID_FUNCTION_NAME) {
        return "ZE_RESULT_ERROR_INVALID_FUNCTION_NAME";
    } else if (result == ZE_RESULT_ERROR_INVALID_GROUP_SIZE_DIMENSION) {
        return "ZE_RESULT_ERROR_INVALID_GROUP_SIZE_DIMENSION";
    } else if (result == ZE_RESULT_ERROR_INVALID_GLOBAL_WIDTH_DIMENSION) {
        return "ZE_RESULT_ERROR_INVALID_GLOBAL_WIDTH_DIMENSION";
    } else if (result == ZE_RESULT_ERROR_INVALID_KERNEL_ARGUMENT_INDEX) {
        return "ZE_RESULT_ERROR_INVALID_KERNEL_ARGUMENT_INDEX";
    } else if (result == ZE_RESULT_ERROR_INVALID_KERNEL_ARGUMENT_SIZE) {
        return "ZE_RESULT_ERROR_INVALID_KERNEL_ARGUMENT_SIZE";
    } else if (result == ZE_RESULT_ERROR_INVALID_KERNEL_ATTRIBUTE_VALUE) {
        return "ZE_RESULT_ERROR_INVALID_KERNEL_ATTRIBUTE_VALUE";
    } else if (result == ZE_RESULT_ERROR_INVALID_MODULE_UNLINKED) {
        return "ZE_RESULT_ERROR_INVALID_MODULE_UNLINKED";
    } else if (result == ZE_RESULT_ERROR_INVALID_COMMAND_LIST_TYPE) {
        return "ZE_RESULT_ERROR_INVALID_COMMAND_LIST_TYPE";
    } else if (result == ZE_RESULT_ERROR_OVERLAPPING_REGIONS) {
        return "ZE_RESULT_ERROR_OVERLAPPING_REGIONS";
    } else if (result == ZE_RESULT_ERROR_UNKNOWN) {
        return "ZE_RESULT_ERROR_UNKNOWN";
    } else {
        return std::to_string(static_cast<int>(result));
    }
}